

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_partitioned_aggregate.cpp
# Opt level: O2

unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> __thiscall
duckdb::PhysicalPartitionedAggregate::GetLocalSinkState
          (PhysicalPartitionedAggregate *this,ExecutionContext *context)

{
  _func_int **in_RAX;
  const_reference pvVar1;
  ExecutionContext *in_RDX;
  _func_int **local_28;
  
  local_28 = in_RAX;
  pvVar1 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)
                      &context->pipeline,0);
  make_uniq<duckdb::PartitionedAggregateLocalSinkState,duckdb::PhysicalPartitionedAggregate_const&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::ExecutionContext&>
            ((duckdb *)&local_28,(PhysicalPartitionedAggregate *)context,&pvVar1->_M_data->types,
             in_RDX);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = local_28;
  return (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)
         (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)this;
}

Assistant:

unique_ptr<LocalSinkState> PhysicalPartitionedAggregate::GetLocalSinkState(ExecutionContext &context) const {
	D_ASSERT(sink_state);
	return make_uniq<PartitionedAggregateLocalSinkState>(*this, children[0].get().GetTypes(), context);
}